

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileinfo.cpp
# Opt level: O0

bool __thiscall QFileInfo::isJunction(QFileInfo *this)

{
  long lVar1;
  bool bVar2;
  anon_class_8_1_54a39804 fsLambda;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  QFileInfoPrivate *d;
  undefined4 in_stack_ffffffffffffffb8;
  MetaDataFlag in_stack_ffffffffffffffbc;
  QFlagsStorage<QFileSystemMetaData::MetaDataFlag> fsFlags;
  
  fsFlags.i = (Int)((ulong)in_RDI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  fsLambda.d = d_func((QFileInfo *)0x2ad565);
  QFlags<QFileSystemMetaData::MetaDataFlag>::QFlags
            ((QFlags<QFileSystemMetaData::MetaDataFlag> *)fsLambda.d,in_stack_ffffffffffffffbc);
  bVar2 = QFileInfoPrivate::
          checkAttribute<bool,QFileInfo::isJunction()const::__0,QFileInfo::isJunction()const::__1>
                    ((QFileInfoPrivate *)
                     CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                     (MetaDataFlags)fsFlags.i,fsLambda,fsLambda);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileInfo::isJunction() const
{
    Q_D(const QFileInfo);
    return d->checkAttribute<bool>(
            QFileSystemMetaData::LegacyLinkType,
            [d]() { return d->metaData.isJunction(); },
            [d]() { return d->getFileFlags(QAbstractFileEngine::LinkType); });
}